

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O0

void __thiscall
cereal::PortableBinaryOutputArchive::saveBinary<1ul>
          (PortableBinaryOutputArchive *this,void *data,size_t size)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  string *what_;
  ulong in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t j;
  size_t i;
  size_t writtenSize;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ulong local_28;
  ulong local_20;
  
  local_20 = 0;
  if ((char)in_RDI[8]._M_string_length == '\0') {
    pcVar2 = (char *)std::ios::rdbuf();
    local_20 = std::streambuf::sputn(pcVar2,in_RSI);
  }
  else {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      bVar1 = false;
      while (!bVar1) {
        pcVar2 = (char *)std::ios::rdbuf();
        lVar3 = std::streambuf::sputn(pcVar2,in_RSI + local_28);
        local_20 = lVar3 + local_20;
        bVar1 = true;
      }
    }
  }
  if (local_20 == in_RDX) {
    return;
  }
  uVar4 = 1;
  what_ = (string *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
  std::operator+((char *)CONCAT17(uVar4,in_stack_ffffffffffffff18),in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,in_stack_ffffffffffffff18),(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Exception::Exception((Exception *)in_RDI,what_);
  __cxa_throw(what_,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline
      void saveBinary( const void * data, std::size_t size )
      {
        std::size_t writtenSize = 0;

        if( itsConvertEndianness )
        {
          for( std::size_t i = 0; i < size; i += DataSize )
            for( std::size_t j = 0; j < DataSize; ++j )
              writtenSize += static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ) + DataSize - j - 1 + i, 1 ) );
        }
        else
          writtenSize = static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ), size ) );

        if(writtenSize != size)
          throw Exception("Failed to write " + std::to_string(size) + " bytes to output stream! Wrote " + std::to_string(writtenSize));
      }